

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

wostream * Centaurus::operator<<(wostream *os,PriorityChainElement *e)

{
  undefined8 in_RAX;
  wostream *pwVar1;
  wchar_t local_18;
  wchar_t local_14;
  
  local_14 = (wchar_t)((ulong)in_RAX >> 0x20);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(e->m_id).m_id._M_dataplus._M_p,(e->m_id).m_id._M_string_length);
  _local_18 = CONCAT44(local_14,0x3a);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_18,1);
  pwVar1 = (wostream *)std::wostream::operator<<((wostream *)pwVar1,e->m_index);
  _local_18 = CONCAT44(0x3d,local_18);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_14,1);
  std::wostream::operator<<((wostream *)pwVar1,e->m_priority);
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChainElement& e)
{
    os << e.id() << L':' << e.index() << L'=' << e.priority();
    return os;
}